

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

bool AdjustCurve(ON_Curve *crv,ON_3dPoint *P0,ON_3dPoint *P1)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ON_3dVector axis;
  ON_3dPoint center;
  bool bVar4;
  int iVar5;
  ON_LineCurve *pOVar6;
  ON_CurveProxy *pOVar7;
  ON_NurbsCurve *crv_00;
  ON_PolyCurve *crv_01;
  ON_3dPoint A1;
  ON_3dPoint A0;
  ON_3dPoint C;
  ON_3dPoint Ac;
  ON_Xform T;
  ON_3dVector Axis;
  ON_3dVector VP;
  ON_3dVector VA;
  ON_3dVector TVec;
  ON_3dPoint Pc;
  ON_3dVector local_198;
  ON_3dPoint local_178;
  ON_3dPoint local_160;
  ON_3dPoint local_148;
  ON_Xform local_128;
  ON_3dVector local_a8;
  ON_3dVector local_90;
  ON_3dVector local_78;
  ON_3dVector local_60;
  ON_3dPoint local_48;
  
  pOVar6 = ON_LineCurve::Cast((ON_Object *)crv);
  if (pOVar6 == (ON_LineCurve *)0x0) {
    pOVar7 = ON_CurveProxy::Cast((ON_Object *)crv);
    if (pOVar7 == (ON_CurveProxy *)0x0) {
      iVar5 = (*(crv->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])(crv);
      if ((char)iVar5 == '\0') {
        pOVar6 = (ON_LineCurve *)ON_PolylineCurve::Cast((ON_Object *)crv);
        if (pOVar6 != (ON_LineCurve *)0x0) {
          AdjustPointListAlongChord((ON_3dPointArray *)&pOVar6->m_line,P0,P1);
          goto LAB_00402650;
        }
        crv_00 = ON_NurbsCurve::Cast((ON_Object *)crv);
        if (crv_00 == (ON_NurbsCurve *)0x0) {
          crv_01 = ON_PolyCurve::Cast((ON_Object *)crv);
          if (crv_01 != (ON_PolyCurve *)0x0) {
            bVar4 = AdjustPolyCurve(crv_01,P0,P1);
            return bVar4;
          }
          ON_Curve::PointAtStart(&local_178,crv);
          ON_Curve::PointAtEnd((ON_3dPoint *)&local_198,crv);
          dVar1 = ON_3dPoint::DistanceTo(&local_178,P0);
          if ((1.490116119385e-08 <= dVar1) ||
             (dVar1 = ON_3dPoint::DistanceTo((ON_3dPoint *)&local_198,P1),
             1.490116119385e-08 <= dVar1)) {
            dVar1 = ON_3dPoint::DistanceTo(&local_178,(ON_3dPoint *)&local_198);
            dVar2 = ON_3dPoint::DistanceTo(P0,P1);
            if ((dVar1 * 0.1 <= dVar2) && (dVar2 * 0.1 <= dVar1)) {
              ON_3dPoint::operator+((ON_3dPoint *)&local_128,&local_178,(ON_3dPoint *)&local_198);
              operator*(&local_148,0.5,(ON_3dPoint *)&local_128);
              ON_3dPoint::operator+((ON_3dPoint *)&local_128,P0,P1);
              operator*(&local_48,0.5,(ON_3dPoint *)&local_128);
              ON_3dPoint::operator-(&local_60,&local_48,&local_148);
              dVar3 = ON_3dVector::Length(&local_60);
              if (1.490116119385e-08 < dVar3) {
                ON_Xform::TranslationTransformation(&local_128,&local_60);
                (*(crv->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])(crv,&local_128);
              }
              ON_Curve::PointAtStart((ON_3dPoint *)&local_128,crv);
              local_178.z = local_128.m_xform[0][2];
              local_178.x = local_128.m_xform[0][0];
              local_178.y = local_128.m_xform[0][1];
              ON_Curve::PointAtEnd((ON_3dPoint *)&local_128,crv);
              local_198.z = local_128.m_xform[0][2];
              local_198.x = local_128.m_xform[0][0];
              local_198.y = local_128.m_xform[0][1];
              dVar3 = ON_3dPoint::DistanceTo(&local_178,P0);
              if ((1.490116119385e-08 <= dVar3) ||
                 (dVar3 = ON_3dPoint::DistanceTo((ON_3dPoint *)&local_198,P1),
                 1.490116119385e-08 <= dVar3)) {
                if (1.490116119385e-08 < ABS(dVar2 - dVar1)) {
                  ON_3dPoint::operator+(&local_160,&local_178,(ON_3dPoint *)&local_198);
                  operator*((ON_3dPoint *)&local_128,0.5,&local_160);
                  local_148.z = local_128.m_xform[0][2];
                  local_148.x = local_128.m_xform[0][0];
                  local_148.y = local_128.m_xform[0][1];
                  ON_Xform::ScaleTransformation(&local_128,&local_148,dVar2 / dVar1);
                  (*(crv->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])(crv,&local_128);
                }
                ON_Curve::PointAtStart((ON_3dPoint *)&local_128,crv);
                local_178.z = local_128.m_xform[0][2];
                local_178.x = local_128.m_xform[0][0];
                local_178.y = local_128.m_xform[0][1];
                ON_Curve::PointAtEnd((ON_3dPoint *)&local_128,crv);
                local_198.z = local_128.m_xform[0][2];
                local_198.x = local_128.m_xform[0][0];
                local_198.y = local_128.m_xform[0][1];
                dVar1 = ON_3dPoint::DistanceTo(&local_178,P0);
                if (((1.490116119385e-08 <= dVar1) ||
                    (dVar1 = ON_3dPoint::DistanceTo((ON_3dPoint *)&local_198,P1),
                    1.490116119385e-08 <= dVar1)) && (1.490116119385e-08 <= dVar2)) {
                  ON_3dPoint::operator+((ON_3dPoint *)&local_128,&local_48,&local_148);
                  operator*(&local_160,0.5,(ON_3dPoint *)&local_128);
                  ON_3dPoint::operator-(&local_78,&local_178,&local_160);
                  ON_3dVector::Unitize(&local_78);
                  ON_3dPoint::operator-(&local_90,P0,&local_160);
                  ON_3dVector::Unitize(&local_90);
                  ON_CrossProduct(&local_a8,&local_78,&local_90);
                  dVar1 = ON_3dVector::Length(&local_a8);
                  if (1.490116119385e-08 <= dVar1) {
                    ON_3dVector::Unitize(&local_a8);
                    dVar2 = ON_3dVector::operator*(&local_78,&local_90);
                    ON_Xform::ON_Xform(&local_128);
                    axis.y._0_4_ = SUB84(local_a8.y,0);
                    axis.x = local_a8.x;
                    axis.y._4_4_ = (int)((ulong)local_a8.y >> 0x20);
                    axis.z = local_a8.z;
                    center.y = local_160.y;
                    center.x = local_160.x;
                    center.z = local_160.z;
                    ON_Xform::Rotation(&local_128,dVar1,dVar2,axis,center);
                    (*(crv->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])
                              (crv,&local_128);
                  }
                }
              }
            }
          }
          iVar5 = (*(crv->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x39])(crv);
          if ((char)iVar5 != '\0') {
            return true;
          }
          iVar5 = (*(crv->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3a])(crv);
          return (bool)(char)iVar5;
        }
        AdjustNurbsCurve(crv_00,P0,P1);
        goto LAB_0040268d;
      }
      bVar4 = ON_3dPoint::operator!=(P0,P1);
      if (!bVar4) {
        ON_Curve::PointAtStart(&local_178,crv);
        ON_3dPoint::operator-(&local_198,P0,&local_178);
        dVar1 = ON_3dVector::Length(&local_198);
        if (dVar1 <= 1.490116119385e-08) {
          return 1.490116119385e-08 < dVar1;
        }
        ON_Xform::TranslationTransformation(&local_128,&local_198);
        (*(crv->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])(crv,&local_128);
        return 1.490116119385e-08 < dVar1;
      }
    }
    bVar4 = false;
  }
  else {
LAB_00402650:
    (*(pOVar6->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x39])(pOVar6);
    (*(pOVar6->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3a])(pOVar6);
LAB_0040268d:
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

static bool AdjustCurve(ON_Curve& crv, 
                        const ON_3dPoint& P0,
                        const ON_3dPoint& P1)

{
  ON_LineCurve* lc = ON_LineCurve::Cast(&crv);
  if (lc){
    lc->SetStartPoint(P0);
    lc->SetEndPoint(P1);
    return true;
  }

  ON_CurveProxy* pc = ON_CurveProxy::Cast(&crv);
  if (pc)
    return false;

  if (crv.IsClosed()){
    if (P0 != P1)
      return false;
    ON_3dPoint P = crv.PointAtStart();
    ON_3dVector TVec = P0-P;
    if (TVec.Length() > ON_SQRT_EPSILON){
      ON_Xform T(ON_Xform::TranslationTransformation(TVec));
      crv.Transform(T);
    }
    else
      return false;
    return true;
  }

  ON_PolylineCurve* plc = ON_PolylineCurve::Cast(&crv);
  if (plc) {
    AdjustPolylineCurve(*plc, P0, P1);
    return true;
  }

  ON_NurbsCurve* nc = ON_NurbsCurve::Cast(&crv);
  if (nc){
    AdjustNurbsCurve(*nc, P0, P1);
    return true;
  }

  ON_PolyCurve* plyc = ON_PolyCurve::Cast(&crv);
  if (plyc){
    return AdjustPolyCurve(*plyc, P0, P1);
  }

  ON_3dPoint A0 = crv.PointAtStart();
  ON_3dPoint A1 = crv.PointAtEnd();

  if (A0.DistanceTo(P0) < ON_SQRT_EPSILON && A1.DistanceTo(P1) < ON_SQRT_EPSILON){
    return (crv.SetStartPoint(P0) || crv.SetEndPoint(P1)) ? true : false;
  }

  double alen = A0.DistanceTo(A1);
  double plen = P0.DistanceTo(P1);
  if (alen < 0.1*plen || plen < 0.1*alen){
    return (crv.SetStartPoint(P0) || crv.SetEndPoint(P1)) ? true : false;
  }

  ON_3dPoint Ac = 0.5*(A0+A1);
  ON_3dPoint Pc = 0.5*(P0+P1);
  ON_3dVector TVec = Pc-Ac;
  if (TVec.Length() > ON_SQRT_EPSILON){
    const ON_Xform T(ON_Xform::TranslationTransformation(TVec));
    crv.Transform(T);
  }

  A0 = crv.PointAtStart();
  A1 = crv.PointAtEnd();
  if (A0.DistanceTo(P0) < ON_SQRT_EPSILON && A1.DistanceTo(P1) < ON_SQRT_EPSILON){
    return (crv.SetStartPoint(P0) || crv.SetEndPoint(P1)) ? true : false;
  }

  if (fabs(plen - alen) > ON_SQRT_EPSILON){
    double scale = plen/alen;
    Ac = 0.5*(A0+A1);
    ON_Xform T(ON_Xform::ScaleTransformation(Ac, scale));
    crv.Transform(T);
  }

  A0 = crv.PointAtStart();
  A1 = crv.PointAtEnd();
  if (A0.DistanceTo(P0) < ON_SQRT_EPSILON && A1.DistanceTo(P1) < ON_SQRT_EPSILON){
    return (crv.SetStartPoint(P0) || crv.SetEndPoint(P1)) ? true : false;
  }

  if (plen < ON_SQRT_EPSILON){
    return (crv.SetStartPoint(P0) || crv.SetEndPoint(P1)) ? true : false;
  }

  ON_3dPoint C = 0.5*(Pc+Ac);
  ON_3dVector VA = A0-C;
  VA.Unitize();
  ON_3dVector VP = P0-C;
  VP.Unitize();

  ON_3dVector Axis = ON_CrossProduct(VA, VP);
  double sina = Axis.Length();
  if (sina < ON_SQRT_EPSILON){
    return (crv.SetStartPoint(P0) || crv.SetEndPoint(P1)) ? true : false;
  }
  Axis.Unitize();
  double cosa = VA*VP;

  ON_Xform T;
  T.Rotation(sina, cosa, Axis, C);
  crv.Transform(T);
  return (crv.SetStartPoint(P0) || crv.SetEndPoint(P1)) ? true : false;
}